

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::RandJoinClauseSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,RandJoinClauseSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  size_t index_local;
  RandJoinClauseSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->rand).kind;
    token._2_1_ = (this->rand).field_0x2;
    token.numFlags.raw = (this->rand).numFlags.raw;
    token.rawLen = (this->rand).rawLen;
    token.info = (this->rand).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    token_00.kind = (this->join).kind;
    token_00._2_1_ = (this->join).field_0x2;
    token_00.numFlags.raw = (this->join).numFlags.raw;
    token_00.rawLen = (this->join).rawLen;
    token_00.info = (this->join).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else if (index == 2) {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)this->expr);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax RandJoinClauseSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return rand;
        case 1: return join;
        case 2: return expr;
        default: return nullptr;
    }
}